

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

int __thiscall
vkt::memory::anon_unknown_0::BufferCopyFromBuffer::verify
          (BufferCopyFromBuffer *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  undefined8 this_00;
  deUint8 val;
  int extraout_EAX;
  ulong local_40;
  size_t ndx;
  Random rng;
  ReferenceMemory_conflict *reference;
  size_t param_2_local;
  VerifyContext *context_local;
  BufferCopyFromBuffer *this_local;
  
  rng.m_rnd._8_8_ = VerifyContext::getReference((VerifyContext *)ctx);
  de::Random::Random((Random *)&ndx,this->m_seed);
  for (local_40 = 0; this_00 = rng.m_rnd._8_8_, local_40 < this->m_bufferSize;
      local_40 = local_40 + 1) {
    val = de::Random::getUint8((Random *)&ndx);
    ReferenceMemory::set((ReferenceMemory *)this_00,local_40,val);
  }
  de::Random::~Random((Random *)&ndx);
  return extraout_EAX;
}

Assistant:

void BufferCopyFromBuffer::verify (VerifyContext& context, size_t)
{
	ReferenceMemory&	reference	(context.getReference());
	de::Random			rng			(m_seed);

	for (size_t ndx = 0; ndx < (size_t)m_bufferSize; ndx++)
		reference.set(ndx, rng.getUint8());
}